

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak)

{
  int iVar1;
  undefined1 auVar2 [16];
  int overflow;
  secp256k1_scalar factor;
  secp256k1_ge p;
  secp256k1_fe zr [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  int local_d7c;
  secp256k1_scalar local_d78;
  undefined1 local_d58 [16];
  undefined1 local_d48 [16];
  secp256k1_strauss_state local_d30;
  secp256k1_ge local_d10;
  undefined1 local_cb8 [104];
  undefined1 local_c50 [16];
  int local_c40;
  secp256k1_fe local_c38 [8];
  secp256k1_strauss_point_state local_af8;
  secp256k1_ge local_6e8 [8];
  secp256k1_gej local_428 [8];
  
  local_d7c = 0;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ec_pubkey_tweak_mul_cold_1();
  }
  else {
    secp256k1_scalar_set_b32(&local_d78,tweak,&local_d7c);
    if (local_d7c == 0) {
      iVar1 = secp256k1_pubkey_load(ctx,&local_d10,pubkey);
      pubkey->data[0] = '\0';
      pubkey->data[1] = '\0';
      pubkey->data[2] = '\0';
      pubkey->data[3] = '\0';
      pubkey->data[4] = '\0';
      pubkey->data[5] = '\0';
      pubkey->data[6] = '\0';
      pubkey->data[7] = '\0';
      pubkey->data[8] = '\0';
      pubkey->data[9] = '\0';
      pubkey->data[10] = '\0';
      pubkey->data[0xb] = '\0';
      pubkey->data[0xc] = '\0';
      pubkey->data[0xd] = '\0';
      pubkey->data[0xe] = '\0';
      pubkey->data[0xf] = '\0';
      pubkey->data[0x10] = '\0';
      pubkey->data[0x11] = '\0';
      pubkey->data[0x12] = '\0';
      pubkey->data[0x13] = '\0';
      pubkey->data[0x14] = '\0';
      pubkey->data[0x15] = '\0';
      pubkey->data[0x16] = '\0';
      pubkey->data[0x17] = '\0';
      pubkey->data[0x18] = '\0';
      pubkey->data[0x19] = '\0';
      pubkey->data[0x1a] = '\0';
      pubkey->data[0x1b] = '\0';
      pubkey->data[0x1c] = '\0';
      pubkey->data[0x1d] = '\0';
      pubkey->data[0x1e] = '\0';
      pubkey->data[0x1f] = '\0';
      pubkey->data[0x20] = '\0';
      pubkey->data[0x21] = '\0';
      pubkey->data[0x22] = '\0';
      pubkey->data[0x23] = '\0';
      pubkey->data[0x24] = '\0';
      pubkey->data[0x25] = '\0';
      pubkey->data[0x26] = '\0';
      pubkey->data[0x27] = '\0';
      pubkey->data[0x28] = '\0';
      pubkey->data[0x29] = '\0';
      pubkey->data[0x2a] = '\0';
      pubkey->data[0x2b] = '\0';
      pubkey->data[0x2c] = '\0';
      pubkey->data[0x2d] = '\0';
      pubkey->data[0x2e] = '\0';
      pubkey->data[0x2f] = '\0';
      pubkey->data[0x30] = '\0';
      pubkey->data[0x31] = '\0';
      pubkey->data[0x32] = '\0';
      pubkey->data[0x33] = '\0';
      pubkey->data[0x34] = '\0';
      pubkey->data[0x35] = '\0';
      pubkey->data[0x36] = '\0';
      pubkey->data[0x37] = '\0';
      pubkey->data[0x38] = '\0';
      pubkey->data[0x39] = '\0';
      pubkey->data[0x3a] = '\0';
      pubkey->data[0x3b] = '\0';
      pubkey->data[0x3c] = '\0';
      pubkey->data[0x3d] = '\0';
      pubkey->data[0x3e] = '\0';
      pubkey->data[0x3f] = '\0';
      if (iVar1 == 0) {
        return 0;
      }
      auVar2._0_4_ = -(uint)((int)local_d78.d[2] == 0 && (int)local_d78.d[0] == 0);
      auVar2._4_4_ = -(uint)(local_d78.d[2]._4_4_ == 0 && local_d78.d[0]._4_4_ == 0);
      auVar2._8_4_ = -(uint)((int)local_d78.d[3] == 0 && (int)local_d78.d[1] == 0);
      auVar2._12_4_ = -(uint)(local_d78.d[3]._4_4_ == 0 && local_d78.d[1]._4_4_ == 0);
      iVar1 = movmskps(iVar1,auVar2);
      if (iVar1 == 0xf) {
        return 0;
      }
      local_d48 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_c40 = local_d10.infinity;
      local_cb8._0_8_ = local_d10.x.n[0];
      local_cb8._8_8_ = local_d10.x.n[1];
      local_cb8._16_8_ = local_d10.x.n[2];
      local_cb8._24_8_ = local_d10.x.n[3];
      local_cb8._32_8_ = local_d10.x.n[4];
      local_cb8._40_8_ = local_d10.y.n[0];
      local_cb8._48_8_ = local_d10.y.n[1];
      local_cb8._56_8_ = local_d10.y.n[2];
      local_cb8._64_8_ = local_d10.y.n[3];
      local_cb8._72_8_ = local_d10.y.n[4];
      local_cb8._80_8_ = 1;
      local_c50 = (undefined1  [16])0x0;
      local_cb8._88_16_ = (undefined1  [16])0x0;
      local_d30.prej = local_428;
      local_d30.zr = local_c38;
      local_d30.pre_a = local_6e8;
      local_d30.ps = &local_af8;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,&local_d30,(secp256k1_gej *)local_cb8,1,(secp256k1_gej *)local_cb8
                 ,&local_d78,(secp256k1_scalar *)local_d58);
      secp256k1_ge_set_gej(&local_d10,(secp256k1_gej *)local_cb8);
      secp256k1_ge_to_storage((secp256k1_ge_storage *)&local_af8,&local_d10);
      *(undefined8 *)(pubkey->data + 0x30) = local_af8.wnaf_na._48_8_;
      *(undefined8 *)(pubkey->data + 0x38) = local_af8.wnaf_na._56_8_;
      *(undefined8 *)(pubkey->data + 0x20) = local_af8.wnaf_na._32_8_;
      *(undefined8 *)(pubkey->data + 0x28) = local_af8.wnaf_na._40_8_;
      *(undefined8 *)(pubkey->data + 0x10) = local_af8.wnaf_na._16_8_;
      *(undefined8 *)(pubkey->data + 0x18) = local_af8.wnaf_na._24_8_;
      *(undefined8 *)pubkey->data = local_af8.wnaf_na._0_8_;
      *(undefined8 *)(pubkey->data + 8) = local_af8.wnaf_na._8_8_;
      return 1;
    }
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&ctx->ecmult_ctx, &p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}